

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int aec_encode_init(aec_stream *strm)

{
  uint uVar1;
  sbyte sVar2;
  internal_state *piVar4;
  code *pcVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  size_t __size;
  int iVar3;
  
  uVar9 = strm->bits_per_sample;
  if (uVar9 - 0x21 < 0xffffffe0) {
    return -1;
  }
  uVar12 = strm->block_size;
  uVar1 = strm->flags;
  if ((uVar1 & 0x40) == 0) {
    uVar11 = uVar12 - 8 >> 3;
    if (7 < (uVar12 << 0x1d | uVar11)) {
      return -1;
    }
    if ((0x8bU >> (uVar11 & 0x1f) & 1) == 0) {
      return -1;
    }
  }
  else if ((uVar12 & 1) != 0) {
    return -1;
  }
  uVar11 = strm->rsi;
  if (0x1000 < uVar11) {
    return -1;
  }
  piVar4 = (internal_state *)calloc(1,0x1a0);
  iVar10 = -4;
  if (piVar4 == (internal_state *)0x0) {
    return -4;
  }
  strm->state = piVar4;
  piVar4->uncomp_len = uVar12 * uVar9;
  if (uVar9 < 0x11) {
    if (uVar9 < 9) {
      iVar8 = 1;
      if ((uVar1 & 0x10) == 0) {
        piVar4->id_len = 3;
        iVar3 = 3;
      }
      else {
        if (4 < uVar9) {
          return -1;
        }
        if (uVar9 < 3) {
          piVar4->id_len = 1;
          iVar3 = iVar8;
        }
        else {
          piVar4->id_len = 2;
          iVar3 = 2;
        }
      }
      sVar2 = (sbyte)iVar3;
      piVar4->bytes_per_sample = 1;
      piVar4->get_sample = aec_get_8;
      piVar4->get_rsi = aec_get_rsi_8;
    }
    else {
      piVar4->id_len = 4;
      piVar4->bytes_per_sample = 2;
      if ((uVar1 & 4) == 0) {
        piVar4->get_sample = aec_get_lsb_16;
        pcVar5 = aec_get_rsi_lsb_16;
      }
      else {
        piVar4->get_sample = aec_get_msb_16;
        pcVar5 = aec_get_rsi_msb_16;
      }
      piVar4->get_rsi = pcVar5;
      iVar8 = 2;
      sVar2 = 4;
    }
  }
  else {
    piVar4->id_len = 5;
    if ((uVar1 & 2) == 0 || 0x18 < uVar9) {
      piVar4->bytes_per_sample = 4;
      if ((uVar1 & 4) == 0) {
        piVar4->get_sample = aec_get_lsb_32;
        pcVar5 = aec_get_rsi_lsb_32;
      }
      else {
        piVar4->get_sample = aec_get_msb_32;
        pcVar5 = aec_get_rsi_msb_32;
      }
      piVar4->get_rsi = pcVar5;
      iVar8 = 4;
    }
    else {
      piVar4->bytes_per_sample = 3;
      if ((uVar1 & 4) == 0) {
        piVar4->get_sample = aec_get_lsb_24;
        pcVar5 = aec_get_rsi_lsb_24;
      }
      else {
        piVar4->get_sample = aec_get_msb_24;
        pcVar5 = aec_get_rsi_msb_24;
      }
      piVar4->get_rsi = pcVar5;
      iVar8 = 3;
    }
    sVar2 = 5;
  }
  uVar12 = uVar12 * uVar11;
  piVar4->rsi_len = iVar8 * uVar12;
  if ((uVar1 & 1) == 0) {
    uVar9 = 0xffffffff >> (-(char)uVar9 & 0x1fU);
    pcVar5 = preprocess_unsigned;
    uVar11 = 0;
  }
  else {
    uVar9 = 0xffffffff >> (0x21U - (char)uVar9 & 0x1f);
    uVar11 = ~uVar9;
    pcVar5 = preprocess_signed;
  }
  piVar4->xmin = uVar11;
  piVar4->xmax = uVar9;
  piVar4->preprocess = pcVar5;
  piVar4->kmax = (1 << sVar2) + -3;
  __size = (ulong)uVar12 << 2;
  puVar6 = (uint32_t *)malloc(__size);
  piVar4->data_pp = puVar6;
  if (puVar6 == (uint32_t *)0x0) {
LAB_00101466:
    cleanup((EVP_PKEY_CTX *)strm);
  }
  else {
    if ((uVar1 & 8) == 0) {
      piVar4->data_raw = puVar6;
    }
    else {
      puVar7 = (uint32_t *)malloc(__size);
      piVar4->data_raw = puVar7;
      if (puVar7 == (uint32_t *)0x0) goto LAB_00101466;
    }
    piVar4->block = puVar6;
    piVar4->ref = 0;
    strm->total_in = 0;
    strm->total_out = 0;
    piVar4->flushed = 0;
    piVar4->cds = piVar4->cds_buf;
    piVar4->cds_buf[0] = '\0';
    piVar4->bits = 8;
    piVar4->mode = m_get_block;
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int aec_encode_init(struct aec_stream *strm)
{
    struct internal_state *state;

    if (strm->bits_per_sample > 32 || strm->bits_per_sample == 0)
        return AEC_CONF_ERROR;

    if (strm->flags & AEC_NOT_ENFORCE) {
        /* All even block sizes are allowed. */
        if (strm->block_size & 1)
            return AEC_CONF_ERROR;
    } else {
        /* Only allow standard conforming block sizes */
        if (strm->block_size != 8
            && strm->block_size != 16
            && strm->block_size != 32
            && strm->block_size != 64)
            return AEC_CONF_ERROR;
    }

    if (strm->rsi > 4096)
        return AEC_CONF_ERROR;

    state = malloc(sizeof(struct internal_state));
    if (state == NULL)
        return AEC_MEM_ERROR;

    memset(state, 0, sizeof(struct internal_state));
    strm->state = state;
    state->uncomp_len = strm->block_size * strm->bits_per_sample;

    if (strm->bits_per_sample > 16) {
        /* 24/32 input bit settings */
        state->id_len = 5;

        if (strm->bits_per_sample <= 24
            && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
            if (strm->flags & AEC_DATA_MSB) {
                state->get_sample = aec_get_msb_24;
                state->get_rsi = aec_get_rsi_msb_24;
            } else {
                state->get_sample = aec_get_lsb_24;
                state->get_rsi = aec_get_rsi_lsb_24;
            }
        } else {
            state->bytes_per_sample = 4;
            if (strm->flags & AEC_DATA_MSB) {
                state->get_sample = aec_get_msb_32;
                state->get_rsi = aec_get_rsi_msb_32;
            } else {
                state->get_sample = aec_get_lsb_32;
                state->get_rsi = aec_get_rsi_lsb_32;
            }
        }
    }
    else if (strm->bits_per_sample > 8) {
        /* 16 bit settings */
        state->id_len = 4;
        state->bytes_per_sample = 2;

        if (strm->flags & AEC_DATA_MSB) {
            state->get_sample = aec_get_msb_16;
            state->get_rsi = aec_get_rsi_msb_16;
        } else {
            state->get_sample = aec_get_lsb_16;
            state->get_rsi = aec_get_rsi_lsb_16;
        }
    } else {
        /* 8 bit settings */
        if (strm->flags & AEC_RESTRICTED) {
            if (strm->bits_per_sample <= 4) {
                if (strm->bits_per_sample <= 2)
                    state->id_len = 1;
                else
                    state->id_len = 2;
            } else {
                return AEC_CONF_ERROR;
            }
        } else {
            state->id_len = 3;
        }
        state->bytes_per_sample = 1;

        state->get_sample = aec_get_8;
        state->get_rsi = aec_get_rsi_8;
    }
    state->rsi_len = strm->rsi * strm->block_size * state->bytes_per_sample;

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample + 1);
        state->xmin = ~state->xmax;
        state->preprocess = preprocess_signed;
    } else {
        state->xmin = 0;
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample);
        state->preprocess = preprocess_unsigned;
    }

    state->kmax = (1U << state->id_len) - 3;

    state->data_pp = malloc(strm->rsi
                            * strm->block_size
                            * sizeof(uint32_t));
    if (state->data_pp == NULL) {
        cleanup(strm);
        return AEC_MEM_ERROR;
    }

    if (strm->flags & AEC_DATA_PREPROCESS) {
        state->data_raw = malloc(strm->rsi
                                 * strm->block_size
                                 * sizeof(uint32_t));
        if (state->data_raw == NULL) {
            cleanup(strm);
            return AEC_MEM_ERROR;
        }
    } else {
        state->data_raw = state->data_pp;
    }

    state->block = state->data_pp;

    state->ref = 0;
    strm->total_in = 0;
    strm->total_out = 0;
    state->flushed = 0;

    state->cds = state->cds_buf;
    *state->cds = 0;
    state->bits = 8;
    state->mode = m_get_block;

    return AEC_OK;
}